

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O1

xmlParserInputPtr
xmlNewInputFromIO(char *url,xmlInputReadCallback ioRead,xmlInputCloseCallback ioClose,void *ioCtxt,
                 int flags)

{
  xmlParserInputBufferPtr buf;
  xmlParserInputPtr pxVar1;
  
  if (ioRead != (xmlInputReadCallback)0x0) {
    buf = xmlAllocParserInputBuffer(XML_CHAR_ENCODING_NONE);
    if (buf != (xmlParserInputBufferPtr)0x0) {
      buf->context = ioCtxt;
      buf->readcallback = ioRead;
      buf->closecallback = ioClose;
      pxVar1 = xmlNewInputInternal(buf,url);
      return pxVar1;
    }
    if (ioClose != (xmlInputCloseCallback)0x0) {
      (*ioClose)(ioCtxt);
    }
  }
  return (xmlParserInputPtr)0x0;
}

Assistant:

xmlParserInputPtr
xmlNewInputFromIO(const char *url, xmlInputReadCallback ioRead,
                  xmlInputCloseCallback ioClose, void *ioCtxt,
                  int flags ATTRIBUTE_UNUSED) {
    xmlParserInputBufferPtr buf;

    if (ioRead == NULL)
	return(NULL);

    buf = xmlAllocParserInputBuffer(XML_CHAR_ENCODING_NONE);
    if (buf == NULL) {
        if (ioClose != NULL)
            ioClose(ioCtxt);
        return(NULL);
    }

    buf->context = ioCtxt;
    buf->readcallback = ioRead;
    buf->closecallback = ioClose;

    return(xmlNewInputInternal(buf, url));
}